

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O2

void learn(mf *data,single_learner *base,example *ec)

{
  features *this;
  uchar uVar1;
  uchar uVar2;
  uchar *puVar3;
  float *pfVar4;
  size_t i;
  pointer pbVar5;
  ulong uVar6;
  features *src;
  features *src_00;
  size_t k;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  uchar local_61;
  features *local_60;
  float local_54;
  single_learner *local_50;
  v_array<unsigned_char> *local_48;
  pointer local_40;
  pointer local_38;
  
  predict<true>(data,base,ec);
  local_54 = (ec->pred).scalar;
  local_50 = base;
  LEARNER::learner<char,_example>::update(base,ec,0);
  (ec->pred).scalar = ec->updated_prediction;
  local_48 = &data->indices;
  copy_array<unsigned_char>(local_48,(v_array<unsigned_char> *)ec);
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)ec);
  local_61 = '\0';
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&local_61);
  local_40 = (data->pairs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = (ec->super_example_predict).feature_space;
  this = &data->temp_features;
  pbVar5 = (data->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar5 != local_40) {
    puVar3 = (uchar *)(pbVar5->_M_dataplus)._M_p;
    uVar1 = *puVar3;
    local_38 = pbVar5;
    if (local_60[(char)uVar1].values._end != local_60[(char)uVar1].values._begin) {
      uVar2 = puVar3[1];
      if (local_60[(char)uVar2].values._end != local_60[(char)uVar2].values._begin) {
        src_00 = local_60 + (char)uVar1;
        src = local_60 + (char)uVar2;
        *(ec->super_example_predict).indices._begin = uVar1;
        features::deep_copy_from(this,src_00);
        for (uVar7 = 1; uVar7 <= data->rank; uVar7 = uVar7 + 1) {
          for (uVar6 = 0; pfVar4 = (src_00->values)._begin,
              uVar6 < (ulong)((long)(src_00->values)._end - (long)pfVar4 >> 2); uVar6 = uVar6 + 1) {
            pfVar4[uVar6] = (data->sub_predictions)._begin[uVar7 * 2] * pfVar4[uVar6];
          }
          LEARNER::learner<char,_example>::update(local_50,ec,uVar7);
          features::deep_copy_from(src_00,this);
        }
        *(ec->super_example_predict).indices._begin = uVar2;
        features::deep_copy_from(this,src);
        for (uVar7 = 1; uVar7 <= data->rank; uVar7 = uVar7 + 1) {
          for (uVar6 = 0; pfVar4 = (src->values)._begin,
              uVar6 < (ulong)((long)(src->values)._end - (long)pfVar4 >> 2); uVar6 = uVar6 + 1) {
            pfVar4[uVar6] = (data->sub_predictions)._begin[uVar7 * 2 + -1] * pfVar4[uVar6];
          }
          LEARNER::learner<char,_example>::update(local_50,ec,data->rank + uVar7);
          (ec->pred).scalar = ec->updated_prediction;
          features::deep_copy_from(src,this);
        }
      }
    }
    pbVar5 = local_38 + 1;
  }
  copy_array<unsigned_char>((v_array<unsigned_char> *)ec,local_48);
  (ec->pred).scalar = local_54;
  return;
}

Assistant:

void learn(mf& data, single_learner& base, example& ec)
{
  // predict with current weights
  predict<true>(data, base, ec);
  float predicted = ec.pred.scalar;

  // update linear weights
  base.update(ec);
  ec.pred.scalar = ec.updated_prediction;

  // store namespace indices
  copy_array(data.indices, ec.indices);

  // erase indices
  ec.indices.clear();
  ec.indices.push_back(0);

  // update interaction terms
  // looping over all pairs of non-empty namespaces
  for (string& i : data.pairs)
  {
    int left_ns = (int)i[0];
    int right_ns = (int)i[1];

    if (ec.feature_space[left_ns].size() > 0 && ec.feature_space[right_ns].size() > 0)
    {
      // set example to left namespace only
      ec.indices[0] = left_ns;

      // store feature values in left namespace
      data.temp_features.deep_copy_from(ec.feature_space[left_ns]);

      for (size_t k = 1; k <= data.rank; k++)
      {
        features& fs = ec.feature_space[left_ns];
        // multiply features in left namespace by r^k * x_r
        for (size_t i = 0; i < fs.size(); ++i) fs.values[i] *= data.sub_predictions[2 * k];

        // update l^k using base learner
        base.update(ec, k);

        // restore left namespace features (undoing multiply)
        fs.deep_copy_from(data.temp_features);

        // compute new l_k * x_l scaling factors
        // base.predict(ec, k);
        // data.sub_predictions[2*k-1] = ec.partial_prediction;
        // ec.pred.scalar = ec.updated_prediction;
      }

      // set example to right namespace only
      ec.indices[0] = right_ns;

      // store feature values for right namespace
      data.temp_features.deep_copy_from(ec.feature_space[right_ns]);

      for (size_t k = 1; k <= data.rank; k++)
      {
        features& fs = ec.feature_space[right_ns];
        // multiply features in right namespace by l^k * x_l
        for (size_t i = 0; i < fs.size(); ++i) fs.values[i] *= data.sub_predictions[2 * k - 1];

        // update r^k using base learner
        base.update(ec, k + data.rank);
        ec.pred.scalar = ec.updated_prediction;

        // restore right namespace features
        fs.deep_copy_from(data.temp_features);
      }
    }
  }
  // restore namespace indices
  copy_array(ec.indices, data.indices);

  // restore original prediction
  ec.pred.scalar = predicted;
}